

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optCompare_bothNotEmptyGreater_Test::optCompare_bothNotEmptyGreater_Test
          (optCompare_bothNotEmptyGreater_Test *this)

{
  optCompare_bothNotEmptyGreater_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__optCompare_bothNotEmptyGreater_Test_0025c058;
  return;
}

Assistant:

TEST(optCompare, bothNotEmptyGreater)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i1{2}, i2{1};
  EXPECT_FALSE(i1 == i2);
  EXPECT_TRUE(i1 != i2);
  EXPECT_FALSE(i1 < i2);
  EXPECT_TRUE(i1 > i2);
  EXPECT_FALSE(i1 <= i2);
  EXPECT_TRUE(i1 >= i2);
}